

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plot.hpp
# Opt level: O2

DrawSpecs * __thiscall
sciplot::Plot::
drawWithVecs<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
          (Plot *this,string *with,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *x,vector<double,_std::allocator<double>_> *vecs)

{
  DrawSpecs *pDVar1;
  int i;
  int __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_298;
  string *local_278;
  string use;
  string local_250;
  string local_230;
  string local_210;
  size_t local_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream datastream;
  
  local_278 = with;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&datastream);
  gnuplot::
  writedataset<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
            ((ostream *)&datastream,this->m_numdatasets,x,vecs);
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  use.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&use);
  for (__val = 2; __val != 3; __val = __val + 1) {
    std::__cxx11::to_string(&local_250,__val);
    std::operator+(&bStack_298,&local_250,":");
    std::__cxx11::string::append((string *)&use);
    std::__cxx11::string::~string((string *)&bStack_298);
    std::__cxx11::string::~string((string *)&local_250);
  }
  std::__cxx11::string::append((char *)&use);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)&this->m_data);
  std::__cxx11::string::~string((string *)&bStack_298);
  std::operator+(&local_250,"\'",&this->m_datafilename);
  std::operator+(&bStack_298,&local_250,"\' index ");
  local_1f0 = this->m_numdatasets;
  this->m_numdatasets = local_1f0 + 1;
  internal::str<unsigned_long>(&local_1e8,&local_1f0);
  std::operator+(&local_1c8,&bStack_298,&local_1e8);
  std::__cxx11::string::string((string *)&local_210,(string *)&use);
  std::__cxx11::string::string((string *)&local_230,(string *)local_278);
  pDVar1 = draw(this,&local_1c8,&local_210,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&bStack_298);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&use);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&datastream);
  return pDVar1;
}

Assistant:

inline auto Plot::drawWithVecs(std::string with, const X& x, const Vecs&... vecs) -> DrawSpecs&
{
    // Write the given vectors x and y as a new data set to the stream
    std::ostringstream datastream;
    gnuplot::writedataset(datastream, m_numdatasets, x, vecs...);

    // Set the using string to "" if X is not vector of strings.
    // Otherwise, x contain xtics strings. Set the `using` string
    // so that these are properly used as xtics.
    std::string use;
    if constexpr(internal::isStringVector<X>) {
        const auto nvecs = sizeof...(Vecs);
        use = "0:"; // here, column 0 means the pseudo column with numbers 0, 1, 2, 3...
        for(auto i = 2; i <= nvecs + 1; ++i)
            use += std::to_string(i) + ":"; // this constructs 0:2:3:4:
        use += "xtic(1)"; // this terminates the string with 0:2:3:4:xtic(1), and thus column 1 is used for the xtics
    }

    // Append new data set to existing data
    m_data += datastream.str();

    // Draw the data saved using a data set with index `m_numdatasets`. Increase number of data sets
    return draw("'" + m_datafilename + "' index " + internal::str(m_numdatasets++), use, with);
}